

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode curl_mime_filedata(curl_mimepart *part,char *filename)

{
  curl_strdup_callback p_Var1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *pcVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  stat sbuf;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  cleanup_part_content(part);
  if (filename != (char *)0x0) {
    iVar2 = stat64(filename,(stat64 *)&sbuf);
    if ((iVar2 == 0) && (iVar2 = access(filename,4), iVar2 == 0)) {
      CVar7 = CURLE_OK;
    }
    else {
      CVar7 = CURLE_READ_ERROR;
    }
    pcVar4 = (*Curl_cstrdup)(filename);
    part->data = pcVar4;
    CVar6 = CURLE_OUT_OF_MEMORY;
    if (pcVar4 == (char *)0x0) {
      CVar7 = CVar6;
    }
    part->datasize = -1;
    if ((CVar7 == CURLE_OK) && ((sbuf.st_mode & 0xf000) == 0x8000)) {
      part->datasize = sbuf.st_size;
      part->seekfunc = mime_file_seek;
    }
    part->readfunc = mime_file_read;
    part->freefunc = mime_file_free;
    part->kind = MIMEKIND_FILE;
    pcVar4 = (*Curl_cstrdup)(filename);
    p_Var1 = Curl_cstrdup;
    if (pcVar4 != (char *)0x0) {
      pcVar5 = __xpg_basename(pcVar4);
      pcVar5 = (*p_Var1)(pcVar5);
      (*Curl_cfree)(pcVar4);
      if (pcVar5 != (char *)0x0) {
        CVar3 = curl_mime_filename(part,pcVar5);
        CVar6 = CVar7;
        if (CVar3 != CURLE_OK) {
          CVar6 = CVar3;
        }
        (*Curl_cfree)(pcVar5);
      }
    }
    return CVar6;
  }
  return CURLE_OK;
}

Assistant:

CURLcode curl_mime_filedata(curl_mimepart *part, const char *filename)
{
  CURLcode result = CURLE_OK;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(filename) {
    char *base;
    struct_stat sbuf;

    if(stat(filename, &sbuf) || access(filename, R_OK))
      result = CURLE_READ_ERROR;

    part->data = strdup(filename);
    if(!part->data)
      result = CURLE_OUT_OF_MEMORY;

    part->datasize = -1;
    if(!result && S_ISREG(sbuf.st_mode)) {
      part->datasize = filesize(filename, sbuf);
      part->seekfunc = mime_file_seek;
    }

    part->readfunc = mime_file_read;
    part->freefunc = mime_file_free;
    part->kind = MIMEKIND_FILE;

    /* As a side effect, set the filename to the current file's base name.
       It is possible to withdraw this by explicitly calling
       curl_mime_filename() with a NULL filename argument after the current
       call. */
    base = strippath(filename);
    if(!base)
      result = CURLE_OUT_OF_MEMORY;
    else {
      CURLcode res = curl_mime_filename(part, base);

      if(res)
        result = res;
      free(base);
    }
  }
  return result;
}